

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-xtra.h
# Opt level: O0

Expression
dither(ComputationGraph *cg,Expression *expr,float pad_value,
      vector<float,_std::allocator<float>_> *aux_mem)

{
  initializer_list<unsigned_int> x;
  initializer_list<dynet::expr::Expression> __l;
  initializer_list<dynet::expr::Expression> __l_00;
  uint *puVar1;
  reference ppNVar2;
  iterator in_RCX;
  long in_RDX;
  undefined8 extraout_RDX;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *in_RSI;
  Dim *in_RDI;
  Expression EVar3;
  Expression right_shift;
  Expression left_shift;
  Expression padded;
  Expression padding;
  Dim *shape;
  Expression *in_stack_fffffffffffffe08;
  Expression *xs;
  Expression *in_stack_fffffffffffffe10;
  Expression *this;
  ComputationGraph *in_stack_fffffffffffffe18;
  Expression *in_stack_fffffffffffffe20;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *this_00;
  Dim *__a;
  undefined1 *puVar4;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> local_178 [2];
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *local_148;
  undefined8 local_140;
  Expression local_120;
  Expression local_110 [2];
  undefined1 local_e8 [48];
  undefined1 *local_b8;
  undefined8 local_b0;
  Expression local_90;
  uint local_7c;
  uint *local_78;
  undefined8 local_70;
  undefined1 local_68 [36];
  undefined1 local_44 [28];
  iterator local_28;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *local_10;
  
  __a = in_RDI;
  local_28 = in_RCX;
  local_10 = in_RSI;
  puVar1 = dynet::VariableIndex::operator_cast_to_unsigned_int_((VariableIndex *)(in_RDX + 8));
  ppNVar2 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::operator[]
                      (in_RSI,(ulong)*puVar1);
  local_44._20_8_ = *ppNVar2 + 0x20;
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)0x149275);
  dynet::Dim::cols((Dim *)local_44._20_8_);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)in_RSI,(size_type)__a,
             (value_type_conflict1 *)in_RDI);
  local_7c = dynet::Dim::cols((Dim *)local_44._20_8_);
  local_78 = &local_7c;
  local_70 = 1;
  puVar4 = local_68;
  x._M_len = (size_type)in_RSI;
  x._M_array = __a->d;
  dynet::Dim::Dim(in_RDI,x);
  dynet::ComputationGraph::add_input((Dim *)local_44,(vector *)local_10);
  dynet::expr::Expression::Expression
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (VariableIndex *)in_stack_fffffffffffffe10);
  dynet::expr::Expression::Expression(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  dynet::expr::Expression::Expression(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  dynet::expr::Expression::Expression(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  local_b0 = 3;
  local_b8 = local_e8;
  std::allocator<dynet::expr::Expression>::allocator((allocator<dynet::expr::Expression> *)0x1493ad)
  ;
  __l._M_len = (size_type)puVar4;
  __l._M_array = local_28;
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)in_RSI,__l
             ,(allocator_type *)__a);
  dynet::expr::
  concatenate<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
             in_stack_fffffffffffffe08);
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
             in_stack_fffffffffffffe20);
  std::allocator<dynet::expr::Expression>::~allocator
            ((allocator<dynet::expr::Expression> *)0x149402);
  dynet::Dim::rows((Dim *)local_44._20_8_);
  this = local_110;
  xs = &local_90;
  dynet::expr::pickrange(this,(uint)xs,2);
  dynet::Dim::rows((Dim *)local_44._20_8_);
  dynet::expr::pickrange(&local_120,(uint)xs,0);
  this_00 = local_178;
  dynet::expr::Expression::Expression(this,xs);
  dynet::expr::Expression::Expression(this,xs);
  dynet::expr::Expression::Expression(this,xs);
  local_140 = 3;
  local_148 = this_00;
  std::allocator<dynet::expr::Expression>::allocator((allocator<dynet::expr::Expression> *)0x1494c4)
  ;
  __l_00._M_len = (size_type)puVar4;
  __l_00._M_array = local_28;
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)in_RSI,
             __l_00,(allocator_type *)__a);
  dynet::expr::
  concatenate_cols<std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)xs);
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector(this_00);
  std::allocator<dynet::expr::Expression>::~allocator
            ((allocator<dynet::expr::Expression> *)0x149513);
  EVar3._8_8_ = extraout_RDX;
  EVar3.pg = (ComputationGraph *)__a;
  return EVar3;
}

Assistant:

Expression dither(ComputationGraph &cg, const Expression &expr, float pad_value, std::vector<float> *aux_mem)
{
    const auto& shape = cg.nodes[expr.i]->dim;
    aux_mem->clear();
    aux_mem->resize(shape.cols(), pad_value);
    Expression padding(&cg, cg.add_input(Dim({shape.cols()}), aux_mem));
    Expression padded = concatenate(std::vector<Expression>({padding, expr, padding}));
    Expression left_shift = pickrange(padded, 2, shape.rows()+2);
    Expression right_shift = pickrange(padded, 0, shape.rows());
    return concatenate_cols(std::vector<Expression>({left_shift, expr, right_shift}));
}